

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void __thiscall Camera::initialize(Camera *this,GLFWwindow *window)

{
  _func_void_GLFWwindow_ptr_double_double *cbfun;
  __0 local_19;
  GLFWwindow *pGStack_18;
  anon_class_1_0_00000001 scroll_callback;
  GLFWwindow *window_local;
  Camera *this_local;
  
  pGStack_18 = window;
  cbfun = initialize(GLFWwindow*)::$_0::operator_cast_to_function_pointer(&local_19);
  glfwSetScrollCallback(window,cbfun);
  return;
}

Assistant:

void Camera::initialize(GLFWwindow  * window) {
    // TODO: FIX
    //glfwSetWindowUserPointer(window, this);
    
    auto scroll_callback = [](GLFWwindow * window, double xoffset, double yoffset) {
        ((Camera *)(window))->scroll(xoffset, yoffset);
    };

    glfwSetScrollCallback(
        window,
        scroll_callback
    );
}